

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLScanner::scanXMLDecl(XMLScanner *this,DeclTypes type)

{
  XMLBufferMgr *pXVar1;
  short *psVar2;
  XMLCh XVar3;
  int iVar4;
  XMLCh *pXVar5;
  XMLReader *pXVar6;
  XMLDocumentHandler *pXVar7;
  DocTypeHandler *pDVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  XMLCh XVar13;
  int iVar14;
  XMLBuffer *pXVar15;
  XMLSize_t XVar16;
  int iVar17;
  XMLCh *pXVar18;
  XMLCh *pXVar19;
  long lVar20;
  Codes toEmit;
  int *piVar21;
  bool skippedSomething;
  XMLBufBid bbName;
  XMLBufBid bbDummy;
  XMLBufBid bbStand;
  XMLBufBid bbEncoding;
  XMLBufBid bbVersion;
  XMLBuffer *buffers [4];
  bool local_105;
  DeclTypes local_104;
  ReaderMgr *local_100;
  int local_f4;
  XMLBuffer *local_f0;
  XMLBuffer *local_e8;
  XMLBuffer *local_e0;
  int local_d8 [6];
  XMLBuffer *local_c0;
  XMLBuffer *local_b8;
  XMLBufferMgr *local_b0;
  XMLBuffer *local_a8;
  XMLBufferMgr *local_a0;
  XMLBuffer *local_98;
  XMLBufferMgr *local_90;
  XMLBuffer *local_88;
  XMLBufferMgr *local_80;
  XMLBuffer *local_78;
  XMLBufferMgr *local_70;
  XMLBuffer *local_68;
  XMLBufferMgr *local_60;
  XMLBuffer *local_58 [5];
  
  pXVar1 = &this->fBufMgr;
  local_104 = type;
  local_e8 = XMLBufferMgr::bidOnBuffer(pXVar1);
  local_68 = local_e8;
  local_60 = pXVar1;
  local_f0 = XMLBufferMgr::bidOnBuffer(pXVar1);
  local_78 = local_f0;
  local_70 = pXVar1;
  local_c0 = XMLBufferMgr::bidOnBuffer(pXVar1);
  local_88 = local_c0;
  local_80 = pXVar1;
  pXVar15 = XMLBufferMgr::bidOnBuffer(pXVar1);
  local_98 = pXVar15;
  local_90 = pXVar1;
  local_e0 = XMLBufferMgr::bidOnBuffer(pXVar1);
  local_d8[0] = -1;
  local_d8[1] = -1;
  local_d8[2] = -1;
  local_d8[3] = 0xffffffff;
  local_58[0] = local_e8;
  local_58[1] = local_f0;
  local_58[2] = local_c0;
  local_100 = &this->fReaderMgr;
  local_f4 = 0;
  local_b8 = pXVar15;
  local_b0 = pXVar1;
  local_a8 = local_e0;
  local_a0 = pXVar1;
  local_58[3] = pXVar15;
LAB_002bfd65:
  ReaderMgr::skipPastSpaces(local_100,&local_105,true);
  XVar13 = ReaderMgr::peekNextChar(local_100);
  if (XVar13 != L'?') {
    if (local_f4 != 0 && local_105 == false) {
      emitError(this,ExpectedWhitespace);
    }
    ReaderMgr::getUpToCharOrWS(local_100,local_e0,L'=');
    XVar16 = local_e0->fIndex;
    if (XVar16 == 0) {
      emitError(this,ExpectedDeclString);
      XVar16 = local_e0->fIndex;
    }
    pXVar5 = local_e0->fBuffer;
    pXVar5[XVar16] = L'\0';
    bVar11 = true;
    pXVar18 = L"version";
    if (pXVar5 == L"version") {
LAB_002bfe63:
      lVar20 = 0;
      bVar9 = false;
      bVar12 = false;
LAB_002bfee3:
      if (local_d8[lVar20] == -1) {
        local_f4 = local_f4 + 1;
        local_d8[lVar20] = local_f4;
      }
      else {
        pXVar5[XVar16] = L'\0';
        emitError(this,DeclStringRep,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else {
      if (pXVar5 == (XMLCh *)0x0) {
LAB_002bfe20:
        if (*pXVar18 == L'\0') goto LAB_002bfe63;
      }
      else {
        pXVar18 = L"version";
        pXVar19 = pXVar5;
        do {
          XVar13 = *pXVar19;
          if (XVar13 == L'\0') goto LAB_002bfe20;
          pXVar19 = pXVar19 + 1;
          XVar3 = *pXVar18;
          pXVar18 = pXVar18 + 1;
        } while (XVar13 == XVar3);
      }
      bVar12 = true;
      lVar20 = 1;
      pXVar18 = L"encoding";
      if (pXVar5 == L"encoding") {
LAB_002bfeaf:
        bVar9 = false;
LAB_002bfee0:
        bVar11 = false;
        goto LAB_002bfee3;
      }
      if (pXVar5 == (XMLCh *)0x0) {
LAB_002bfe6c:
        if (*pXVar18 == L'\0') goto LAB_002bfeaf;
      }
      else {
        pXVar18 = L"encoding";
        pXVar19 = pXVar5;
        do {
          XVar13 = *pXVar19;
          if (XVar13 == L'\0') goto LAB_002bfe6c;
          pXVar19 = pXVar19 + 1;
          XVar3 = *pXVar18;
          pXVar18 = pXVar18 + 1;
        } while (XVar13 == XVar3);
      }
      bVar9 = true;
      lVar20 = 2;
      pXVar18 = L"standalone";
      if (pXVar5 == L"standalone") {
LAB_002bfede:
        bVar12 = false;
        goto LAB_002bfee0;
      }
      if (pXVar5 == (XMLCh *)0x0) {
LAB_002bfeb4:
        if (*pXVar18 == L'\0') goto LAB_002bfede;
      }
      else {
        pXVar18 = L"standalone";
        pXVar19 = pXVar5;
        do {
          XVar13 = *pXVar19;
          if (XVar13 == L'\0') goto LAB_002bfeb4;
          pXVar19 = pXVar19 + 1;
          XVar3 = *pXVar18;
          pXVar18 = pXVar18 + 1;
        } while (XVar13 == XVar3);
      }
      bVar9 = false;
      emitError(this,ExpectedDeclString,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      lVar20 = 3;
      bVar12 = false;
      bVar11 = false;
    }
    bVar10 = scanEq(this,true);
    if (!bVar10) {
      emitError(this,ExpectedEqSign);
    }
    pXVar15 = local_58[lVar20];
    bVar10 = getQuotedString(this,pXVar15);
    if (!bVar10) {
      emitError(this,ExpectedQuotedString);
      goto LAB_002c0264;
    }
    pXVar5 = pXVar15->fBuffer;
    pXVar5[pXVar15->fIndex] = L'\0';
    if (bVar11) {
      if (pXVar5 == L"1.1") {
LAB_002c0073:
        if (local_104 != Decl_XML) goto LAB_002c00b4;
        this->fXMLVersion = XMLV1_1;
        (this->fReaderMgr).fXMLVersion = XMLV1_1;
        pXVar6 = (this->fReaderMgr).fCurReader;
        pXVar6->fXMLVersion = XMLV1_1;
        pXVar6->fNEL = true;
        pXVar6->fgCharCharsTable = &XMLChar1_1::fgCharCharsTable1_1;
      }
      else {
        pXVar18 = L"1.1";
        if (pXVar5 == (XMLCh *)0x0) {
LAB_002c0030:
          if (*pXVar18 == L'\0') goto LAB_002c0073;
        }
        else {
          pXVar18 = L"1.1";
          pXVar19 = pXVar5;
          do {
            XVar13 = *pXVar19;
            if (XVar13 == L'\0') goto LAB_002c0030;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar18;
            pXVar18 = pXVar18 + 1;
          } while (XVar13 == XVar3);
        }
        if (pXVar5 != L"1.0") {
          pXVar18 = L"1.0";
          if (pXVar5 == (XMLCh *)0x0) {
LAB_002c00c4:
            if (*pXVar18 == L'\0') goto LAB_002c010d;
          }
          else {
            pXVar18 = L"1.0";
            pXVar19 = pXVar5;
            do {
              XVar13 = *pXVar19;
              if (XVar13 == L'\0') goto LAB_002c00c4;
              pXVar19 = pXVar19 + 1;
              XVar3 = *pXVar18;
              pXVar18 = pXVar18 + 1;
            } while (XVar13 == XVar3);
          }
          lVar20 = 0;
          do {
            psVar2 = (short *)((long)&XMLUni::fgVersion1 + lVar20);
            lVar20 = lVar20 + 2;
          } while (*psVar2 != 0);
          iVar14 = XMLString::compareNString(pXVar5,L"1.",(lVar20 >> 1) - 1);
          if (iVar14 == 0) goto LAB_002c010d;
          goto LAB_002c00f0;
        }
LAB_002c010d:
        if (local_104 == Decl_XML) {
          this->fXMLVersion = XMLV1_0;
          (this->fReaderMgr).fXMLVersion = XMLV1_0;
          pXVar6 = (this->fReaderMgr).fCurReader;
          pXVar6->fXMLVersion = XMLV1_0;
          pXVar6->fNEL = (bool)XMLChar1_0::enableNEL;
          pXVar6->fgCharCharsTable = &XMLChar1_0::fgCharCharsTable1_0;
        }
      }
    }
    else if (bVar12) {
      bVar11 = XMLString::isValidEncName(pXVar5);
      if (!bVar11) {
        emitError(this,BadXMLEncoding,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else if (bVar9) {
      if (pXVar5 == L"yes") {
LAB_002c01f6:
        this->fStandalone = true;
        goto LAB_002bfd65;
      }
      pXVar18 = L"yes";
      if (pXVar5 == (XMLCh *)0x0) {
LAB_002c0157:
        if (*pXVar18 == L'\0') goto LAB_002c01f6;
      }
      else {
        pXVar18 = L"yes";
        pXVar19 = pXVar5;
        do {
          XVar13 = *pXVar19;
          if (XVar13 == L'\0') goto LAB_002c0157;
          pXVar19 = pXVar19 + 1;
          XVar3 = *pXVar18;
          pXVar18 = pXVar18 + 1;
        } while (XVar13 == XVar3);
      }
      if (pXVar5 != L"no") {
        pXVar18 = L"no";
        if (pXVar5 == (XMLCh *)0x0) {
LAB_002c019e:
          if (*pXVar18 == L'\0') goto LAB_002c0221;
        }
        else {
          pXVar18 = L"no";
          pXVar19 = pXVar5;
          do {
            XVar13 = *pXVar19;
            if (XVar13 == L'\0') goto LAB_002c019e;
            pXVar19 = pXVar19 + 1;
            XVar3 = *pXVar18;
            pXVar18 = pXVar18 + 1;
          } while (XVar13 == XVar3);
        }
        emitError(this,BadStandalone);
        if (pXVar15->fIndex != 2) {
          if ((((pXVar15->fIndex == 3) && ((XMLCh)(*pXVar5 | 0x20U) == 0x79)) &&
              ((XMLCh)(pXVar5[1] | 0x20U) == 0x65)) && ((XMLCh)(pXVar5[2] | 0x20U) == 0x73))
          goto LAB_002c01f6;
          goto LAB_002bfd65;
        }
        if (((XMLCh)(*pXVar5 | 0x20U) != 0x6e) || ((XMLCh)(pXVar5[1] | 0x20U) != 0x6f))
        goto LAB_002bfd65;
      }
LAB_002c0221:
      this->fStandalone = false;
    }
    goto LAB_002bfd65;
  }
  iVar14 = 0;
  piVar21 = local_d8;
  bVar11 = true;
  do {
    bVar12 = bVar11;
    iVar4 = *piVar21;
    if ((iVar4 != -1) && (iVar17 = iVar14 + 1, iVar14 = iVar4, iVar4 != iVar17)) {
      emitError(this,DeclStringsInWrongOrder);
      break;
    }
    piVar21 = local_d8 + 1;
    bVar11 = false;
  } while (bVar12);
  if ((local_104 == Decl_XML) && (toEmit = XMLVersionRequired, local_d8[0] == -1)) {
LAB_002c02a4:
    emitError(this,toEmit);
  }
  else if (local_104 == Decl_Text) {
    if (local_d8[2] != -1) {
      emitError(this,StandaloneNotLegal);
    }
    if (local_d8[1] == -1) {
      toEmit = EncodingRequired;
      goto LAB_002c02a4;
    }
  }
  bVar11 = ReaderMgr::skippedChar(local_100,L'?');
  if (bVar11) {
    bVar11 = ReaderMgr::skippedChar(local_100,L'>');
    if (!bVar11) {
      emitError(this,UnterminatedXMLDecl);
      do {
        XVar13 = ReaderMgr::getNextChar(local_100);
        if (XVar13 == L'>') break;
      } while (XVar13 != L'\0');
    }
  }
  else {
    emitError(this,UnterminatedXMLDecl);
    do {
      XVar13 = ReaderMgr::getNextChar(local_100);
      if (XVar13 == L'\0') break;
    } while (XVar13 != L'>');
  }
  ReaderMgr::getCurrentEncodingStr(local_100);
  if (local_d8[1] != -1) {
    pXVar6 = (this->fReaderMgr).fCurReader;
    pXVar5 = local_f0->fBuffer;
    pXVar5[local_f0->fIndex] = L'\0';
    bVar11 = XMLReader::setEncoding(pXVar6,pXVar5);
    pXVar5 = local_f0->fBuffer;
    pXVar5[local_f0->fIndex] = L'\0';
    if (!bVar11) {
      emitError(this,ContradictoryEncoding,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  if (local_104 == Decl_XML) {
    pXVar7 = this->fDocHandler;
    if (pXVar7 != (XMLDocumentHandler *)0x0) {
      local_e8->fBuffer[local_e8->fIndex] = L'\0';
      local_f0->fBuffer[local_f0->fIndex] = L'\0';
      local_c0->fBuffer[local_c0->fIndex] = L'\0';
      (*pXVar7->_vptr_XMLDocumentHandler[0xd])();
    }
  }
  else if ((local_104 == Decl_Text) &&
          (pDVar8 = this->fDocTypeHandler, pDVar8 != (DocTypeHandler *)0x0)) {
    local_e8->fBuffer[local_e8->fIndex] = L'\0';
    local_f0->fBuffer[local_f0->fIndex] = L'\0';
    (*pDVar8->_vptr_DocTypeHandler[0x11])();
  }
LAB_002c0437:
  pXVar1 = local_b0;
  XMLBufferMgr::releaseBuffer(local_b0,local_e0);
  XMLBufferMgr::releaseBuffer(pXVar1,local_b8);
  pXVar15 = local_f0;
  XMLBufferMgr::releaseBuffer(pXVar1,local_c0);
  XMLBufferMgr::releaseBuffer(pXVar1,pXVar15);
  XMLBufferMgr::releaseBuffer(pXVar1,local_e8);
  return;
  while (XVar13 != L'\0') {
LAB_002c0264:
    XVar13 = ReaderMgr::getNextChar(local_100);
    if (XVar13 == L'>') break;
  }
  goto LAB_002c0437;
LAB_002c00b4:
  if (this->fXMLVersion != XMLV1_1) {
LAB_002c00f0:
    emitError(this,UnsupportedXMLVersion,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  goto LAB_002bfd65;
}

Assistant:

void XMLScanner::scanXMLDecl(const DeclTypes type)
{
    // Get us some buffers to use
    XMLBufBid bbVersion(&fBufMgr);
    XMLBufBid bbEncoding(&fBufMgr);
    XMLBufBid bbStand(&fBufMgr);
    XMLBufBid bbDummy(&fBufMgr);
    XMLBufBid bbName(&fBufMgr);

    //  We use this little enum and array to keep up with what we found
    //  and what order we found them in. This lets us get them free form
    //  without too much overhead, but still know that they were in the
    //  wrong order.
    enum Strings
    {
        VersionString
        , EncodingString
        , StandaloneString
        , UnknownString

        , StringCount
    };
    int flags[StringCount] = { -1, -1, -1, -1 };

    //  Also set up a list of buffers in the right order so that we know
    //  where to put stuff.
    XMLBuffer* buffers[StringCount] ;
    buffers[0] = &bbVersion.getBuffer();
    buffers[1] = &bbEncoding.getBuffer();
    buffers[2] = &bbStand.getBuffer();
    buffers[3] = &bbDummy.getBuffer();

    int curCount = 0;
    Strings curString;
    XMLBuffer& nameBuf = bbName.getBuffer();
    while (true)
    {
        // Skip any spaces
        bool skippedSomething;
        fReaderMgr.skipPastSpaces(skippedSomething, true);

        // If we are looking at a question mark, then break out
        if (fReaderMgr.lookingAtChar(chQuestion))
            break;

        // If this is not the first string, then we require the spaces
        if (!skippedSomething && curCount)
            emitError(XMLErrs::ExpectedWhitespace);

        //  Get characters up to the next whitespace or equal's sign.
        if (!scanUpToWSOr(nameBuf, chEqual))
            emitError(XMLErrs::ExpectedDeclString);

        // See if it matches any of our expected strings
        if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgVersionString))
            curString = VersionString;
        else if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgEncodingString))
            curString = EncodingString;
        else if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgStandaloneString))
            curString = StandaloneString;
        else
            curString = UnknownString;

        //  If its an unknown string, then give that error. Else check to
        //  see if this one has been done already and give that error.
        if (curString == UnknownString)
            emitError(XMLErrs::ExpectedDeclString, nameBuf.getRawBuffer());
        else if (flags[curString] != -1)
            emitError(XMLErrs::DeclStringRep, nameBuf.getRawBuffer());
        else if (flags[curString] == -1)
            flags[curString] = ++curCount;

        //  Scan for an equal's sign. If we don't find it, issue an error
        //  but keep trying to go on.
        if (!scanEq(true))
            emitError(XMLErrs::ExpectedEqSign);

        //  Get a quote string into the buffer for the string that we are
        //  currently working on.
        if (!getQuotedString(*buffers[curString]))
        {
            emitError(XMLErrs::ExpectedQuotedString);
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // And validate the value according which one it was
        const XMLCh* rawValue = buffers[curString]->getRawBuffer();
        if (curString == VersionString)
        {
            if (XMLString::equals(rawValue, XMLUni::fgVersion1_1)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_1;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_1);
                }
                else {
                    if (fXMLVersion != XMLReader::XMLV1_1)
                        emitError(XMLErrs::UnsupportedXMLVersion, rawValue);
                }
            }
            else if (XMLString::equals(rawValue, XMLUni::fgVersion1_0)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_0;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_0);
                }
            }
            else if (XMLString::startsWith(rawValue, XMLUni::fgVersion1)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_0;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_0);
                }
            }
            else
                emitError(XMLErrs::UnsupportedXMLVersion, rawValue);
        }
         else if (curString == EncodingString)
        {
            if (!XMLString::isValidEncName(rawValue))
                emitError(XMLErrs::BadXMLEncoding, rawValue);
        }
         else if (curString == StandaloneString)
        {
            if (XMLString::equals(rawValue, XMLUni::fgYesString))
                fStandalone = true;
            else if (XMLString::equals(rawValue, XMLUni::fgNoString))
                fStandalone = false;
            else
            {
                emitError(XMLErrs::BadStandalone);
                //if (!XMLString::compareIString(rawValue, XMLUni::fgYesString))
                //else if (!XMLString::compareIString(rawValue, XMLUni::fgNoString))
                if (buffers[curString]->getLen() == 3 &&
                    (((rawValue[0] == chLatin_y) || (rawValue[0] == chLatin_Y)) &&
                     ((rawValue[1] == chLatin_e) || (rawValue[1] == chLatin_E)) &&
                     ((rawValue[2] == chLatin_s) || (rawValue[2] == chLatin_S))))
                    fStandalone = true;
                else if (buffers[curString]->getLen() == 2 &&
                    (((rawValue[0] == chLatin_n) || (rawValue[0] == chLatin_N)) &&
                     ((rawValue[1] == chLatin_o) || (rawValue[1] == chLatin_O))))
                    fStandalone = false;
            }
        }
    }

    //  Make sure that the strings present are in order. We don't care about
    //  which ones are present at this point, just that any there are in the
    //  right order.
    int curTop = 0;
    for (int index = VersionString; index < StandaloneString; index++)
    {
        if (flags[index] != -1)
        {
            if (flags[index] !=  curTop + 1)
            {
                emitError(XMLErrs::DeclStringsInWrongOrder);
                break;
            }
            curTop = flags[index];
        }
    }

    //  If its an XML decl, the version must be present.
    //  If its a Text decl, then encoding must be present AND standalone must not be present.
    if ((type == Decl_XML) && (flags[VersionString] == -1))
        emitError(XMLErrs::XMLVersionRequired);
    else if (type == Decl_Text) {
        if (flags[StandaloneString] != -1)
            emitError(XMLErrs::StandaloneNotLegal);
        if (flags[EncodingString] == -1)
            emitError(XMLErrs::EncodingRequired);
    }

    if (!fReaderMgr.skippedChar(chQuestion))
    {
        emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr.skipPastChar(chCloseAngle);
    }
     else if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr.skipPastChar(chCloseAngle);
    }

    //  Do this before we possibly update the reader with the
    //  actual encoding string. Otherwise, we will pass the wrong thing
    //  for the last parameter!
    const XMLCh* actualEnc = fReaderMgr.getCurrentEncodingStr();

    //  Ok, we've now seen the real encoding string, if there was one, so
    //  lets call back on the current reader and tell it what the real
    //  encoding string was. If it fails, that's because it represents some
    //  sort of contradiction with the autosensed format, and it keeps the
    //  original encoding.
    //
    //  NOTE: This can fail for a number of reasons, such as a bogus encoding
    //  name or because its in flagrant contradiction of the auto-sensed
    //  format.
    if (flags[EncodingString] != -1)
    {
        if (!fReaderMgr.getCurrentReader()->setEncoding(bbEncoding.getRawBuffer()))
            emitError(XMLErrs::ContradictoryEncoding, bbEncoding.getRawBuffer());
        else
            actualEnc = bbEncoding.getRawBuffer();
    }

    //  If we have a document handler then call the XML Decl callback.
    if (type == Decl_XML)
    {
        if (fDocHandler)
            fDocHandler->XMLDecl
            (
                bbVersion.getRawBuffer()
                , bbEncoding.getRawBuffer()
                , bbStand.getRawBuffer()
                , actualEnc
            );
    }
    else if (type == Decl_Text)
    {
        if (fDocTypeHandler)
            fDocTypeHandler->TextDecl
            (
                bbVersion.getRawBuffer()
                , bbEncoding.getRawBuffer()
            );
    }
}